

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O0

Var Js::TaggedInt::Increment(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  Var pvVar4;
  undefined4 *puVar5;
  undefined8 local_28;
  Var result;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  
  local_28._0_4_ = (int)aValue;
  local_28 = (Var)CONCAT44((int)((ulong)aValue >> 0x20),(int)local_28 + 1);
  pvVar4 = MinVal();
  if (local_28 == pvVar4) {
    aValue_local = IncrementOverflowHelper(scriptContext);
  }
  else {
    iVar3 = ToInt32(aValue);
    pvVar4 = ToVarUnchecked(iVar3 + 1);
    if (local_28 != pvVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                  ,0x242,"(result == ToVarUnchecked( ToInt32(aValue) + 1 ))",
                                  "Logic error in Int31::Increment");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    aValue_local = local_28;
  }
  return aValue_local;
}

Assistant:

Var TaggedInt::Increment(Var aValue, ScriptContext* scriptContext)
    {
#if _M_IX86


        __asm
        {
            mov     eax, aValue
            add     eax, 2
            jno     LblDone
            push    scriptContext
            call    TaggedInt::IncrementOverflowHelper
        LblDone:
            ; result is in eax
        }
#else

#if INT32VAR
        Var result = aValue;
        (*(unsigned int *)&result)++;  // unsigned to avoid signed int overflow
#else
        unsigned int n = reinterpret_cast<unsigned int>(aValue);
        n += 2;
        Var result = reinterpret_cast<Var>(n);
#endif

        // Wrap-around
        if( result == MinVal() )
        {
            // Use New instead of ToVar for this constant
            return IncrementOverflowHelper(scriptContext);
        }

        AssertMsg( result == ToVarUnchecked( ToInt32(aValue) + 1 ), "Logic error in Int31::Increment" );
        return result;
#endif
    }